

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O0

void duckdb::FSSTVector::SetCount(Vector *vector,idx_t count)

{
  bool bVar1;
  VectorFSSTStringBuffer *this;
  _Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false> in_RSI;
  VectorFSSTStringBuffer *fsst_string_buffer;
  VectorBuffer *in_stack_ffffffffffffffc0;
  shared_ptr<duckdb::VectorFSSTStringBuffer,_true> *in_stack_ffffffffffffffc8;
  shared_ptr<duckdb::VectorBuffer,_true> *in_stack_ffffffffffffffd0;
  _Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false> local_10;
  
  local_10._M_head_impl = in_RSI._M_head_impl;
  bVar1 = shared_ptr<duckdb::VectorBuffer,_true>::operator_bool
                    ((shared_ptr<duckdb::VectorBuffer,_true> *)0x2bd388c);
  if (!bVar1) {
    in_stack_ffffffffffffffc0 = (VectorBuffer *)&stack0xffffffffffffffe0;
    make_buffer<duckdb::VectorFSSTStringBuffer>();
    shared_ptr<duckdb::VectorBuffer,_true>::operator=<duckdb::VectorFSSTStringBuffer,_0>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    shared_ptr<duckdb::VectorFSSTStringBuffer,_true>::~shared_ptr
              ((shared_ptr<duckdb::VectorFSSTStringBuffer,_true> *)0x2bd38be);
  }
  shared_ptr<duckdb::VectorBuffer,_true>::operator->
            ((shared_ptr<duckdb::VectorBuffer,_true> *)in_stack_ffffffffffffffc0);
  this = VectorBuffer::Cast<duckdb::VectorFSSTStringBuffer>(in_stack_ffffffffffffffc0);
  VectorFSSTStringBuffer::SetCount(this,(idx_t)local_10._M_head_impl);
  return;
}

Assistant:

void FSSTVector::SetCount(Vector &vector, idx_t count) {
	D_ASSERT(vector.GetType().InternalType() == PhysicalType::VARCHAR);

	if (!vector.auxiliary) {
		vector.auxiliary = make_buffer<VectorFSSTStringBuffer>();
	}
	D_ASSERT(vector.auxiliary->GetBufferType() == VectorBufferType::FSST_BUFFER);

	auto &fsst_string_buffer = vector.auxiliary->Cast<VectorFSSTStringBuffer>();
	fsst_string_buffer.SetCount(count);
}